

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_float(flatcc_json_parser_t *ctx,char *buf,char *end,float *v)

{
  int iVar1;
  int iVar2;
  char *local_40;
  char *k;
  char *next;
  float *v_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *v = 0.0;
  ctx_local = (flatcc_json_parser_t *)buf;
  if (buf != end) {
    local_40 = buf;
    if (*buf == '-') {
      local_40 = buf + 1;
    }
    if (((long)end - (long)local_40 < 2) ||
       ((*local_40 != '.' && ((*local_40 != '0' || (local_40[1] != '0')))))) {
      ctx_local = (flatcc_json_parser_t *)parse_float(buf,(long)end - (long)buf,v);
      if ((ctx_local == (flatcc_json_parser_t *)0x0) || (ctx_local == (flatcc_json_parser_t *)buf))
      {
        iVar2 = 1;
        if ((int)*v < 0) {
          iVar2 = -1;
        }
        iVar1 = 0;
        if (ABS(*v) == INFINITY) {
          iVar1 = iVar2;
        }
        if (iVar1 == 0) {
          ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,6);
        }
        else {
          ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,7);
        }
      }
    }
    else {
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,6);
    }
  }
  return (char *)ctx_local;
}

Assistant:

const char *flatcc_json_parser_float(flatcc_json_parser_t *ctx, const char *buf, const char *end, float *v)
{
    const char *next, *k;

    *v = 0.0;
    if (buf == end) {
        return buf;
    }
    k = buf;
    if (*buf == '-') ++k;
    if (end - k > 1 && (k[0] == '.' || (k[0] == '0' && k[1] == '0'))) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_numeric);
    }
    next = parse_float(buf, (size_t)(end - buf), v);
    if (next == 0 || next == buf) {
        if (parse_float_isinf(*v)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_overflow);
        }
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_numeric);
    }
    return next;
}